

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_SpawnBlood
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *originator;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  DAngle local_40;
  DVector3 local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      originator = (AActor *)(param->field_0).field_1.a;
      if (originator != (AActor *)0x0) {
        if ((originator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
          (originator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (originator->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042f7a3;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar4 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\x01') {
                      if (numparam == 5) {
                        pcVar4 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          local_38.X = (double)param[1].field_0.field_1.a;
                          local_38.Y = (double)param[2].field_0.field_1.a;
                          local_38.Z = (double)param[3].field_0.field_1.a;
                          local_40.Degrees = (double)param[4].field_0.field_1.a;
                          P_SpawnBlood(&local_38,&local_40,param[5].field_0.i,originator);
                          return 0;
                        }
                        pcVar4 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar4,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                    ,0x16d7,
                                    "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
                  }
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x16d6,
                                "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar4 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x16d5,
                            "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x16d4,
                        "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x16d3,
                    "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042f7a3:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x16d2,
                "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnBlood)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(dir);
	PARAM_INT(damage);
	P_SpawnBlood(DVector3(x, y, z), dir, damage, self);
	return 0;
}